

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O2

size_t nni_base64_decode(char *in,size_t in_len,uint8_t *out,size_t out_len)

{
  char cVar1;
  ushort **ppuVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong local_38;
  
  uVar4 = 0;
  uVar5 = 0;
  uVar3 = 0;
  local_38 = 0;
  do {
    if (in_len <= uVar4) {
      return local_38;
    }
    ppuVar2 = __ctype_b_loc();
    cVar1 = in[uVar4];
    if ((*(byte *)((long)*ppuVar2 + (long)cVar1 * 2 + 1) & 0x20) == 0) {
      if (cVar1 == '=') {
        return local_38;
      }
      if ((byte)(&DAT_00142790)[cVar1] == 0xff) {
        return local_38;
      }
      uVar3 = uVar3 << 6 | (uint)(byte)(&DAT_00142790)[cVar1];
      if (uVar5 < 2) {
        uVar5 = uVar5 + 6;
      }
      else {
        if (out_len <= local_38) {
          return 0xffffffffffffffff;
        }
        uVar5 = uVar5 - 2;
        out[local_38] = (uint8_t)(uVar3 >> ((byte)uVar5 & 0x1f));
        local_38 = local_38 + 1;
      }
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

size_t
nni_base64_decode(const char *in, size_t in_len, uint8_t *out, size_t out_len)
{
	unsigned ii;
	unsigned rem;
	uint32_t v;
	uint8_t  ch;
	size_t   io;

	// Unrolled lookup of ASCII code points.
	// 0xFF represents a non-base64 valid character.
	const uint8_t decode[256] = { 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
		0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
		0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
		0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
		0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0x3E, 0xFF, 0xFF, 0xFF,
		0x3F, 0x34, 0x35, 0x36, 0x37, 0x38, 0x39, 0x3A, 0x3B, 0x3C,
		0x3D, 0xFF, 0xFF, 0xFF, 0x3E, 0xFF, 0xFF, 0xFF, 0x00, 0x01,
		0x02, 0x03, 0x04, 0x05, 0x06, 0x07, 0x08, 0x09, 0x0A, 0x0B,
		0x0C, 0x0D, 0x0E, 0x0F, 0x10, 0x11, 0x12, 0x13, 0x14, 0x15,
		0x16, 0x17, 0x18, 0x19, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
		0x1A, 0x1B, 0x1C, 0x1D, 0x1E, 0x1F, 0x20, 0x21, 0x22, 0x23,
		0x24, 0x25, 0x26, 0x27, 0x28, 0x29, 0x2A, 0x2B, 0x2C, 0x2D,
		0x2E, 0x2F, 0x30, 0x31, 0x32, 0x33, 0xFF, 0xFF, 0xFF, 0xFF,
		0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
		0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
		0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
		0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
		0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
		0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
		0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
		0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
		0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
		0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
		0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
		0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
		0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF };

	for (io = 0, ii = 0, v = 0, rem = 0; ii < in_len; ii++) {
		if (isspace(in[ii])) {
			continue;
		}

		if (in[ii] == '=') {
			break;
		}

		ch = decode[(int) (in[ii])];

		// Discard invalid characters as per RFC 2045.
		if (ch == 0xFF) {
			break;
		}

		v = (v << 6u) | ch;
		rem += 6;

		if (rem >= 8) {
			rem -= 8;
			if (io >= out_len)
				return (-1);
			out[io++] = (v >> rem) & 255u;
		}
	}
	if (rem >= 8) {
		rem -= 8;
		if (io >= out_len)
			return (-1);
		out[io++] = (v >> rem) & 255u;
	}
	return (io);
}